

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optimistic_lock.hpp
# Opt level: O2

void __thiscall unodb::optimistic_lock::version_type::dump(version_type *this,ostream *os)

{
  ostream *poVar1;
  ulong uVar2;
  
  poVar1 = std::operator<<(os,"version = 0x");
  *(uint *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x18) =
       *(uint *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x18) & 0xffffffb5 | 8;
  poVar1 = std::operator<<(poVar1,0x30);
  *(undefined8 *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x10) = 8;
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  *(uint *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x18) =
       *(uint *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x18) & 0xffffffb5 | 2;
  uVar2 = this->version;
  if ((uVar2 & 2) != 0) {
    std::operator<<(os," (write locked)");
    uVar2 = this->version;
  }
  if (uVar2 == 1) {
    std::operator<<(os," (obsoleted)");
    return;
  }
  return;
}

Assistant:

[[gnu::cold]] UNODB_DETAIL_NOINLINE void dump(std::ostream &os) const {
      os << "version = 0x" << std::hex << std::setfill('0') << std::setw(8)
         << version << std::dec;
      if (is_write_locked()) os << " (write locked)";
      if (is_obsolete()) os << " (obsoleted)";
    }